

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O0

void completeHessianDiagonal(HighsOptions *options,HighsHessian *hessian)

{
  value_type vVar1;
  uint uVar2;
  HighsInt HVar3;
  reference pvVar4;
  reference pvVar5;
  uint *puVar6;
  uint *in_RSI;
  long in_RDI;
  bool bVar7;
  HighsInt iEl_2;
  bool no_diagonal_entry;
  HighsInt iEl_1;
  HighsInt iCol_1;
  HighsInt num_missing_diagonal_entries_added;
  HighsInt next_start;
  HighsInt to_iEl;
  HighsInt new_num_nz;
  HighsInt iEl;
  HighsInt iCol;
  HighsInt num_nz;
  HighsInt dim;
  HighsInt num_missing_diagonal_entries;
  size_type in_stack_ffffffffffffffa8;
  value_type vVar8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar9;
  int local_3c;
  uint local_38;
  int local_30;
  int local_2c;
  int local_20;
  uint local_14;
  
  local_14 = 0;
  local_38 = *in_RSI;
  uVar2 = HighsHessian::numNz((HighsHessian *)0x6b873b);
  for (local_20 = 0; local_20 < (int)local_38; local_20 = local_20 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_20);
    if (*pvVar4 < (int)uVar2) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)*pvVar4);
      if (*pvVar4 != local_20) {
        local_14 = local_14 + 1;
      }
    }
    else {
      local_14 = local_14 + 1;
    }
  }
  highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kInfo,
              "Hessian has dimension %d and %d nonzeros: inserting %d zeros onto the diagonal\n",
              (ulong)local_38,(ulong)uVar2,(ulong)local_14);
  if (local_14 != 0) {
    HVar3 = HighsHessian::numNz((HighsHessian *)0x6b87f9);
    local_2c = HVar3 + local_14;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    local_30 = HighsHessian::numNz((HighsHessian *)0x6b8839);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)(int)local_38);
    *pvVar4 = local_2c;
    while (local_38 = local_38 - 1, local_3c = local_30, -1 < (int)local_38) {
      while( true ) {
        local_3c = local_3c + -1;
        iVar9 = local_3c;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)(int)local_38);
        if (iVar9 <= *pvVar4) break;
        local_2c = local_2c + -1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_3c);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_2c);
        *pvVar4 = vVar1;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)local_3c
                           );
        vVar8 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)local_2c
                           );
        *pvVar5 = vVar8;
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)(int)local_38);
      if (*pvVar4 < local_30) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)(int)local_38);
        iVar9 = *pvVar4;
        local_2c = local_2c + -1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)iVar9);
        vVar1 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_2c);
        *pvVar4 = vVar1;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)iVar9);
        vVar8 = *pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)local_2c
                           );
        *pvVar5 = vVar8;
        puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)iVar9);
        bVar7 = *puVar6 != local_38;
      }
      else {
        bVar7 = true;
      }
      if (bVar7) {
        local_2c = local_2c + -1;
        puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_2c
                                   );
        *puVar6 = local_38;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)local_2c
                           );
        *pvVar5 = 0.0;
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)(int)local_38);
      local_30 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)(int)local_38);
      *pvVar4 = local_2c;
    }
  }
  return;
}

Assistant:

void completeHessianDiagonal(const HighsOptions& options,
                             HighsHessian& hessian) {
  // Count the number of missing diagonal entries
  HighsInt num_missing_diagonal_entries = 0;
  const HighsInt dim = hessian.dim_;
  const HighsInt num_nz = hessian.numNz();
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iEl = hessian.start_[iCol];
    if (iEl < num_nz) {
      if (hessian.index_[iEl] != iCol) num_missing_diagonal_entries++;
    } else {
      num_missing_diagonal_entries++;
    }
  }
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "Hessian has dimension %d and %d nonzeros: inserting %d zeros "
              "onto the diagonal\n",
              (int)dim, (int)num_nz, (int)num_missing_diagonal_entries);
  assert(num_missing_diagonal_entries >= dim - num_nz);
  if (!num_missing_diagonal_entries) return;
  // There are missing diagonal entries to be inserted as explicit zeros
  const HighsInt new_num_nz = hessian.numNz() + num_missing_diagonal_entries;
  HighsInt to_iEl = new_num_nz;
  hessian.index_.resize(new_num_nz);
  hessian.value_.resize(new_num_nz);
  HighsInt next_start = hessian.numNz();
  hessian.start_[dim] = to_iEl;
  HighsInt num_missing_diagonal_entries_added = 0;
  for (HighsInt iCol = dim - 1; iCol >= 0; iCol--) {
    // Shift the entries that are sure to be off-diagonal
    for (HighsInt iEl = next_start - 1; iEl > hessian.start_[iCol]; iEl--) {
      assert(hessian.index_[iEl] != iCol);
      to_iEl--;
      hessian.index_[to_iEl] = hessian.index_[iEl];
      hessian.value_[to_iEl] = hessian.value_[iEl];
    }
    // Now consider any first entry. If there is none, or if it's not
    // the diagonal, then there is no diagonal entry for this column
    bool no_diagonal_entry;
    if (hessian.start_[iCol] < next_start) {
      const HighsInt iEl = hessian.start_[iCol];
      // Copy the first entry
      to_iEl--;
      hessian.index_[to_iEl] = hessian.index_[iEl];
      hessian.value_[to_iEl] = hessian.value_[iEl];
      // If the first entry isn't the diagonal, then there is no
      // diagonal entry for this column
      no_diagonal_entry = hessian.index_[iEl] != iCol;
    } else {
      no_diagonal_entry = true;
    }
    if (no_diagonal_entry) {
      // There is no diagonal entry, so have insert an explicit zero
      to_iEl--;
      hessian.index_[to_iEl] = iCol;
      hessian.value_[to_iEl] = 0;
      num_missing_diagonal_entries_added++;
      assert(num_missing_diagonal_entries_added <=
             num_missing_diagonal_entries);
    }
    next_start = hessian.start_[iCol];
    hessian.start_[iCol] = to_iEl;
  }
  assert(to_iEl == 0);
}